

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::store_flattened_struct(CompilerGLSL *this,uint32_t lhs_id,uint32_t value)

{
  SPIRType *type;
  string basename;
  string local_80;
  SmallVector<unsigned_int,_8UL> local_60;
  
  type = Compiler::expression_type(&this->super_Compiler,lhs_id);
  to_flattened_access_chain_expression_abi_cxx11_(&local_80,this,lhs_id);
  local_60.super_VectorView<unsigned_int>.ptr = (uint *)&local_60.stack_storage;
  local_60.super_VectorView<unsigned_int>.buffer_size = 0;
  local_60.buffer_capacity = 8;
  store_flattened_struct(this,&local_80,value,type,&local_60);
  SmallVector<unsigned_int,_8UL>::~SmallVector(&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void CompilerGLSL::store_flattened_struct(uint32_t lhs_id, uint32_t value)
{
	auto &type = expression_type(lhs_id);
	auto basename = to_flattened_access_chain_expression(lhs_id);
	store_flattened_struct(basename, value, type, {});
}